

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::parsePluginData(Moc *this,ClassDef *def)

{
  bool bVar1;
  IncludePath *pIVar2;
  Parser *this_00;
  ulong uVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  IncludePath *p;
  add_const_t<QList<Parser::IncludePath>_> *__range5;
  QByteArray msg_2;
  QByteArray msg_1;
  QFile file;
  QByteArray msg;
  const_iterator __end5;
  const_iterator __begin5;
  QFileInfo fi;
  QByteArray metaDataFile;
  QByteArray l;
  QByteArray metaData;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
  *in_stack_fffffffffffffb78;
  Parser *in_stack_fffffffffffffb80;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
  *this_01;
  Parser *in_stack_fffffffffffffb88;
  QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]> *a;
  QByteArrayView *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffbc8;
  char *in_stack_fffffffffffffbd8;
  undefined1 **msg_00;
  Parser *in_stack_fffffffffffffbe0;
  QJsonDocument local_340 [80];
  QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]> local_2f0 [3];
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
  local_278;
  undefined1 *local_238;
  undefined1 *puStack_230;
  undefined1 *local_228;
  undefined1 local_210 [24];
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_188;
  undefined1 *puStack_180;
  undefined1 *local_178;
  QFileInfo local_168 [8];
  char *local_160;
  storage_type *local_158;
  undefined1 local_148 [24];
  char *local_130;
  storage_type *local_128;
  undefined1 local_118 [24];
  QDir local_100 [8];
  IncludePath *local_f8;
  const_iterator local_f0;
  const_iterator local_e8;
  undefined1 local_e0 [24];
  undefined1 local_c8 [24];
  QFileInfo local_b0 [8];
  QDir local_a8 [8];
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_60;
  char *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QJsonParseError local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next(in_stack_fffffffffffffb80,(Token)((ulong)in_stack_fffffffffffffb78 >> 0x20));
  local_20 = (QJsonParseError)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x134fbd);
  while (bVar1 = Parser::test(in_stack_fffffffffffffb88,
                              (Token)((ulong)in_stack_fffffffffffffb80 >> 0x20)), bVar1) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    Parser::lexem(in_stack_fffffffffffffb88);
    local_40 = "IID";
    bVar1 = ::operator==((QByteArray *)in_stack_fffffffffffffb90,(char **)in_stack_fffffffffffffb88)
    ;
    if (bVar1) {
      Parser::next(in_stack_fffffffffffffb80,(Token)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      Parser::unquotedLexem(in_stack_fffffffffffffb88);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffb80,(QByteArray *)in_stack_fffffffffffffb78);
      QByteArray::~QByteArray((QByteArray *)0x135088);
    }
    else {
      local_60 = "URI";
      bVar1 = ::operator==((QByteArray *)in_stack_fffffffffffffb90,
                           (char **)in_stack_fffffffffffffb88);
      if (bVar1) {
        Parser::next(in_stack_fffffffffffffb80,(Token)((ulong)in_stack_fffffffffffffb78 >> 0x20));
        Parser::unquotedLexem(in_stack_fffffffffffffb88);
        QByteArray::operator=
                  ((QByteArray *)in_stack_fffffffffffffb80,(QByteArray *)in_stack_fffffffffffffb78);
        QByteArray::~QByteArray((QByteArray *)0x135105);
      }
      else {
        local_80 = "FILE";
        bVar1 = ::operator==((QByteArray *)in_stack_fffffffffffffb90,
                             (char **)in_stack_fffffffffffffb88);
        if (bVar1) {
          Parser::next(in_stack_fffffffffffffb80,(Token)((ulong)in_stack_fffffffffffffb78 >> 0x20));
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          local_90 = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          Parser::unquotedLexem(in_stack_fffffffffffffb88);
          local_a0 = &DAT_aaaaaaaaaaaaaaaa;
          std::stack<QByteArray,_QList<QByteArray>_>::top
                    ((stack<QByteArray,_QList<QByteArray>_> *)in_stack_fffffffffffffb80);
          QString::fromLocal8Bit<void>((QByteArray *)in_stack_fffffffffffffb80);
          QFileInfo::QFileInfo(local_b0,(QString *)local_c8);
          QFileInfo::dir();
          QString::fromLocal8Bit<void>((QByteArray *)in_stack_fffffffffffffb80);
          QFileInfo::QFileInfo((QFileInfo *)&local_a0,local_a8,(QString *)local_e0);
          QString::~QString((QString *)0x13521b);
          QDir::~QDir(local_a8);
          QFileInfo::~QFileInfo(local_b0);
          QString::~QString((QString *)0x135242);
          local_e8.i = (IncludePath *)&DAT_aaaaaaaaaaaaaaaa;
          local_e8 = QList<Parser::IncludePath>::begin
                               ((QList<Parser::IncludePath> *)in_stack_fffffffffffffb80);
          local_f0.i = (IncludePath *)&DAT_aaaaaaaaaaaaaaaa;
          local_f0 = QList<Parser::IncludePath>::end
                               ((QList<Parser::IncludePath> *)in_stack_fffffffffffffb80);
          while( true ) {
            local_f8 = local_f0.i;
            bVar1 = QList<Parser::IncludePath>::const_iterator::operator!=(&local_e8,local_f0);
            if (!bVar1) break;
            pIVar2 = QList<Parser::IncludePath>::const_iterator::operator*(&local_e8);
            uVar3 = QFileInfo::exists();
            if ((uVar3 & 1) != 0) break;
            if (((byte)pIVar2[0x18] & 1) == 0) {
              local_130 = QByteArray::constData((QByteArray *)0x13533a);
              QByteArrayView::QByteArrayView<const_char_*,_true>
                        (in_stack_fffffffffffffb90,(char **)in_stack_fffffffffffffb88);
              QVar4.m_data = local_128;
              QVar4.m_size = (qsizetype)local_118;
              QString::fromLocal8Bit(QVar4);
              QDir::QDir(local_100,(QString *)local_118);
              local_160 = QByteArray::constData((QByteArray *)0x135396);
              QByteArrayView::QByteArrayView<const_char_*,_true>
                        (in_stack_fffffffffffffb90,(char **)in_stack_fffffffffffffb88);
              QVar5.m_data = local_158;
              QVar5.m_size = (qsizetype)local_148;
              QString::fromLocal8Bit(QVar5);
              QFileInfo::setFile((QDir *)&local_a0,(QString *)local_100);
              QString::~QString((QString *)0x1353fa);
              QDir::~QDir(local_100);
              QString::~QString((QString *)0x135414);
              uVar3 = QFileInfo::isDir();
              if ((uVar3 & 1) != 0) {
                QFileInfo::QFileInfo(local_168);
                QFileInfo::operator=
                          ((QFileInfo *)in_stack_fffffffffffffb80,
                           (QFileInfo *)in_stack_fffffffffffffb78);
                QFileInfo::~QFileInfo(local_168);
              }
            }
            QList<Parser::IncludePath>::const_iterator::operator++(&local_e8);
          }
          uVar3 = QFileInfo::exists();
          if ((uVar3 & 1) == 0) {
            local_188 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_180 = &DAT_aaaaaaaaaaaaaaaa;
            local_178 = &DAT_aaaaaaaaaaaaaaaa;
            Parser::lexem(in_stack_fffffffffffffb88);
            ::operator+((char (*) [22])in_stack_fffffffffffffb88,
                        (QByteArray *)in_stack_fffffffffffffb80);
            ::operator+((QStringBuilder<const_char_(&)[22],_QByteArray> *)in_stack_fffffffffffffb88,
                        (char (*) [45])in_stack_fffffffffffffb80);
            msg_00 = &local_188;
            ::QStringBuilder::operator_cast_to_QByteArray
                      ((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>
                        *)in_stack_fffffffffffffb78);
            QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>
                             *)0x135516);
            QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder
                      ((QStringBuilder<const_char_(&)[22],_QByteArray> *)0x135520);
            QByteArray::~QByteArray((QByteArray *)0x13552a);
            this_00 = (Parser *)QByteArray::constData((QByteArray *)0x135534);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              Parser::error(this_00,(char *)msg_00);
            }
            goto LAB_001359fe;
          }
          local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
          local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::canonicalFilePath();
          QFile::QFile((QFile *)&local_1f8,(QString *)local_210);
          QString::~QString((QString *)0x1355b7);
          QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffb80,
                     (OpenModeFlag)((ulong)in_stack_fffffffffffffb78 >> 0x20));
          uVar3 = QFile::open((QFlags_conflict *)&local_1f8);
          if ((uVar3 & 1) == 0) {
            local_238 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_230 = &DAT_aaaaaaaaaaaaaaaa;
            local_228 = &DAT_aaaaaaaaaaaaaaaa;
            Parser::lexem(in_stack_fffffffffffffb88);
            ::operator+((char (*) [22])in_stack_fffffffffffffb88,
                        (QByteArray *)in_stack_fffffffffffffb80);
            ::operator+((QStringBuilder<const_char_(&)[22],_QByteArray> *)in_stack_fffffffffffffb88,
                        (char (*) [23])in_stack_fffffffffffffb80);
            QIODevice::errorString();
            a = local_2f0;
            QString::toUtf8((QString *)in_stack_fffffffffffffb78);
            this_01 = &local_278;
            ::operator+(a,(QByteArray *)this_01);
            ::QStringBuilder::operator_cast_to_QByteArray(in_stack_fffffffffffffb78);
            QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
            ::~QStringBuilder(this_01);
            QByteArray::~QByteArray((QByteArray *)0x1356d1);
            QString::~QString((QString *)0x1356db);
            QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>
                             *)0x1356e5);
            QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder
                      ((QStringBuilder<const_char_(&)[22],_QByteArray> *)0x1356ef);
            QByteArray::~QByteArray((QByteArray *)0x1356f9);
            QByteArray::constData((QByteArray *)0x135703);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              Parser::error(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
            }
            goto LAB_001359fe;
          }
          in_stack_fffffffffffffb78 =
               (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
                *)(in_RDI + 0xf8);
          QFileInfo::canonicalFilePath();
          QList<QString>::append
                    ((QList<QString> *)in_stack_fffffffffffffb80,
                     (rvalue_ref)in_stack_fffffffffffffb78);
          QString::~QString((QString *)0x135773);
          QIODevice::readAll();
          QByteArray::operator=
                    ((QByteArray *)in_stack_fffffffffffffb80,(QByteArray *)in_stack_fffffffffffffb78
                    );
          QByteArray::~QByteArray((QByteArray *)0x1357aa);
          QFile::~QFile((QFile *)&local_1f8);
          QFileInfo::~QFileInfo((QFileInfo *)&local_a0);
          QByteArray::~QByteArray((QByteArray *)0x1357d1);
        }
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x1357e2);
  }
  bVar1 = QByteArray::isEmpty((QByteArray *)0x1357f4);
  if (!bVar1) {
    QJsonDocument::fromJson((QByteArray *)local_340,&local_20);
    QJsonDocument::operator=
              ((QJsonDocument *)in_stack_fffffffffffffb80,(QJsonDocument *)in_stack_fffffffffffffb78
              );
    QJsonDocument::~QJsonDocument(local_340);
    uVar3 = QJsonDocument::isObject();
    if ((uVar3 & 1) == 0) {
      Parser::lexem(in_stack_fffffffffffffb88);
      ::operator+((char (*) [22])in_stack_fffffffffffffb88,(QByteArray *)in_stack_fffffffffffffb80);
      ::operator+((QStringBuilder<const_char_(&)[22],_QByteArray> *)in_stack_fffffffffffffb88,
                  (char (*) [67])in_stack_fffffffffffffb80);
      ::QStringBuilder::operator_cast_to_QByteArray
                ((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[67]>
                  *)in_stack_fffffffffffffb78);
      QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[67]>::
      ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[67]>
                       *)0x1358fb);
      QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder
                ((QStringBuilder<const_char_(&)[22],_QByteArray> *)0x135908);
      QByteArray::~QByteArray((QByteArray *)0x135915);
      QByteArray::constData((QByteArray *)0x135922);
      Parser::warning(in_stack_fffffffffffffb80,in_stack_fffffffffffffbc8);
      QByteArray::QByteArray((QByteArray *)0x13593c);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffb80,(QByteArray *)in_stack_fffffffffffffb78);
      QByteArray::~QByteArray((QByteArray *)0x135965);
      QByteArray::QByteArray((QByteArray *)0x135972);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffb80,(QByteArray *)in_stack_fffffffffffffb78);
      QByteArray::~QByteArray((QByteArray *)0x13599f);
      QByteArray::~QByteArray((QByteArray *)0x1359b4);
      goto LAB_001359d3;
    }
  }
  *(undefined1 *)(in_RDI + 0x71) = 1;
  Parser::next(in_stack_fffffffffffffb80,(Token)((ulong)in_stack_fffffffffffffb78 >> 0x20));
LAB_001359d3:
  QByteArray::~QByteArray((QByteArray *)0x1359e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_001359fe:
  __stack_chk_fail();
}

Assistant:

void Moc::parsePluginData(ClassDef *def)
{
    next(LPAREN);
    QByteArray metaData;
    while (test(IDENTIFIER)) {
        QByteArray l = lexem();
        if (l == "IID") {
            next(STRING_LITERAL);
            def->pluginData.iid = unquotedLexem();
        } else if (l == "URI") {
            next(STRING_LITERAL);
            def->pluginData.uri = unquotedLexem();
        } else if (l == "FILE") {
            next(STRING_LITERAL);
            QByteArray metaDataFile = unquotedLexem();
            QFileInfo fi(QFileInfo(QString::fromLocal8Bit(currentFilenames.top())).dir(),
                         QString::fromLocal8Bit(metaDataFile));
            for (const IncludePath &p : std::as_const(includes)) {
                if (fi.exists())
                    break;
                if (p.isFrameworkPath)
                    continue;

                fi.setFile(QString::fromLocal8Bit(p.path.constData()), QString::fromLocal8Bit(metaDataFile.constData()));
                // try again, maybe there's a file later in the include paths with the same name
                if (fi.isDir()) {
                    fi = QFileInfo();
                    continue;
                }
            }
            if (!fi.exists()) {
                const QByteArray msg = "Plugin Metadata file " + lexem()
                        + " does not exist. Declaration will be ignored";
                error(msg.constData());
                return;
            }
            QFile file(fi.canonicalFilePath());
            if (!file.open(QFile::ReadOnly)) {
                QByteArray msg = "Plugin Metadata file " + lexem() + " could not be opened: "
                    + file.errorString().toUtf8();
                error(msg.constData());
                return;
            }
            parsedPluginMetadataFiles.append(fi.canonicalFilePath());
            metaData = file.readAll();
        }
    }

    if (!metaData.isEmpty()) {
        def->pluginData.metaData = QJsonDocument::fromJson(metaData);
        if (!def->pluginData.metaData.isObject()) {
            const QByteArray msg = "Plugin Metadata file " + lexem()
                    + " does not contain a valid JSON object. Declaration will be ignored";
            warning(msg.constData());
            def->pluginData.iid = QByteArray();
            def->pluginData.uri = QByteArray();
            return;
        }
    }

    mustIncludeQPluginH = true;
    next(RPAREN);
}